

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deString.c
# Opt level: O0

deUint32 deStringHashLeading(char *str,int numLeadingChars)

{
  bool bVar1;
  int local_1c;
  deUint32 local_18;
  uint c;
  deUint32 hash;
  int numLeadingChars_local;
  char *str_local;
  
  local_18 = 0x1505;
  c = numLeadingChars;
  _hash = str;
  while( true ) {
    bVar1 = false;
    if (c != 0) {
      local_1c = (int)*_hash;
      bVar1 = local_1c != 0;
      _hash = _hash + 1;
    }
    if (!bVar1) break;
    local_18 = local_18 * 0x21 + local_1c;
    c = c - 1;
  }
  return local_18;
}

Assistant:

deUint32 deStringHashLeading (const char* str, int numLeadingChars)
{
	deUint32 hash = 5381;
	unsigned int c;

	DE_ASSERT(str);
	while (numLeadingChars-- && (c = (unsigned int)*str++) != 0)
		hash = (hash << 5) + hash + c;

	return hash;
}